

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O0

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CGetLengthExp *exp)

{
  bool bVar1;
  pointer pIVar2;
  TypeInfo local_198;
  TypeInfo local_170;
  CError local_148;
  TypeInfo local_118;
  undefined1 local_f0 [8];
  string errorMessage;
  TypeInfo local_d0;
  TypeInfo local_a8;
  CError local_80;
  TypeInfo local_40;
  CGetLengthExp *local_18;
  CGetLengthExp *exp_local;
  CTypeCheckerVisitor *this_local;
  
  local_18 = exp;
  exp_local = (CGetLengthExp *)this;
  std::operator<<((ostream *)&std::cout,"typechecker: CGetLengthExp\n");
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_18->arrayIdentifier);
  if (bVar1) {
    pIVar2 = std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::operator->
                       (&local_18->arrayIdentifier);
    (**(pIVar2->super_PositionedNode).super_INode._vptr_INode)(pIVar2,this);
    TypeInfo::TypeInfo(&local_40,ERROR_TYPE);
    bVar1 = ::operator==(&this->lastCalculatedType,&local_40);
    TypeInfo::~TypeInfo(&local_40);
    if (!bVar1) {
      TypeInfo::TypeInfo(&local_d0,INT_ARRAY);
      bVar1 = ::operator!=(&this->lastCalculatedType,&local_d0);
      TypeInfo::~TypeInfo(&local_d0);
      if (bVar1) {
        TypeInfo::TypeInfo(&local_118,INT_ARRAY);
        CError::GetTypeErrorMessage_abi_cxx11_
                  ((CError *)local_f0,&local_118,&this->lastCalculatedType);
        TypeInfo::~TypeInfo(&local_118);
        CError::CError(&local_148,(string *)local_f0,
                       &(local_18->super_IExpression).super_PositionedNode.position);
        std::vector<CError,_std::allocator<CError>_>::push_back(&this->errors,&local_148);
        CError::~CError(&local_148);
        TypeInfo::TypeInfo(&local_170,ERROR_TYPE);
        TypeInfo::operator=(&this->lastCalculatedType,&local_170);
        TypeInfo::~TypeInfo(&local_170);
        std::__cxx11::string::~string((string *)local_f0);
      }
      else {
        TypeInfo::TypeInfo(&local_198,INT);
        TypeInfo::operator=(&this->lastCalculatedType,&local_198);
        TypeInfo::~TypeInfo(&local_198);
      }
    }
  }
  else {
    CError::CError(&local_80,(string *)CError::AST_ERROR_abi_cxx11_,
                   &(local_18->super_IExpression).super_PositionedNode.position);
    std::vector<CError,_std::allocator<CError>_>::push_back(&this->errors,&local_80);
    CError::~CError(&local_80);
    TypeInfo::TypeInfo(&local_a8,ERROR_TYPE);
    TypeInfo::operator=(&this->lastCalculatedType,&local_a8);
    TypeInfo::~TypeInfo(&local_a8);
  }
  return;
}

Assistant:

void CTypeCheckerVisitor::Visit( CGetLengthExp &exp ) 
{
    std::cout << "typechecker: CGetLengthExp\n";

    if( exp.arrayIdentifier ) {
		exp.arrayIdentifier->Accept( *this );
        if( lastCalculatedType == enums::TPrimitiveType::ERROR_TYPE ) {
            return;
        }
	} else {
        errors.push_back( CError( CError::AST_ERROR, exp.position ) );
        lastCalculatedType = enums::TPrimitiveType::ERROR_TYPE;
        return;
    }

	if( lastCalculatedType != enums::TPrimitiveType::INT_ARRAY ) {
		auto errorMessage = CError::GetTypeErrorMessage( enums::TPrimitiveType::INT_ARRAY, lastCalculatedType );
		errors.push_back( CError( errorMessage, exp.position ) );
		lastCalculatedType = enums::TPrimitiveType::ERROR_TYPE;
		return;
	}
	lastCalculatedType = enums::TPrimitiveType::INT;
}